

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

StructElement * __thiscall
soul::PoolAllocator::
allocate<soul::heart::StructElement,soul::CodeLocation&,soul::heart::Expression&,std::__cxx11::string&>
          (PoolAllocator *this,CodeLocation *args,Expression *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  pointer pcVar1;
  PoolItem *pPVar2;
  CodeLocation local_50;
  string local_40;
  
  pPVar2 = allocateSpaceForObject(this,0x40);
  local_50.sourceCode.object = (args->sourceCode).object;
  if (local_50.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_50.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_50.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_50.location.data = (args->location).data;
  pcVar1 = (args_2->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + args_2->_M_string_length);
  heart::StructElement::StructElement((StructElement *)&pPVar2->item,&local_50,args_1,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.sourceCode.object);
  pPVar2->destructor =
       allocate<soul::heart::StructElement,_soul::CodeLocation_&,_soul::heart::Expression_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
       ::anon_class_1_0_00000001::__invoke;
  return (StructElement *)&pPVar2->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }